

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

Node * __thiscall llvm::yaml::KeyValueNode::getValue(KeyValueNode *this)

{
  TokenKind TVar1;
  Scanner *this_00;
  unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *puVar2;
  char *pcVar3;
  bool bVar4;
  Node *pNVar5;
  Token *pTVar6;
  Document *pDVar7;
  undefined1 local_70 [80];
  
  if (this->Value != (Node *)0x0) {
    return this->Value;
  }
  pNVar5 = getKey(this);
  (*pNVar5->_vptr_Node[1])(pNVar5);
  pDVar7 = (((this->super_Node).Doc)->_M_t).
           super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>.
           _M_t.
           super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
           .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl;
  this_00 = *(Scanner **)&pDVar7->stream->scanner;
  if (this_00->Failed != true) {
    pTVar6 = Scanner::peekNext(this_00);
    TVar1 = pTVar6->Kind;
    if (TVar1 < TK_Scalar) {
      if ((0x18901U >> (TVar1 & (TK_Key|TK_FlowMappingEnd)) & 1) != 0) {
        pNVar5 = (Node *)BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                                   (&((((this->super_Node).Doc)->_M_t).
                                      super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                      .super__Head_base<0UL,_llvm::yaml::Document_*,_false>.
                                     _M_head_impl)->NodeAllocator,0x48,0x10);
        puVar2 = (this->super_Node).Doc;
        pNVar5->_vptr_Node = (_func_int **)&PTR_anchor_00213e80;
        ((StringRef *)&pNVar5->Doc)->Data = (char *)puVar2;
        (pNVar5->SourceRange).Start.Ptr = (char *)0x0;
        (pNVar5->SourceRange).End.Ptr = (char *)0x0;
        pNVar5->TypeID = 0;
        (pNVar5->Tag).Data = (char *)0x0;
        (pNVar5->Tag).Length = 0;
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&pNVar5->Anchor)->_M_allocated_capacity = 0;
        *(undefined8 *)((long)&pNVar5->Anchor + 8) = 0;
        pTVar6 = Scanner::peekNext(*(Scanner **)
                                    &((puVar2->_M_t).
                                      super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                      .super__Head_base<0UL,_llvm::yaml::Document_*,_false>.
                                     _M_head_impl)->stream->scanner);
        pcVar3 = (pTVar6->Range).Data;
        (pNVar5->SourceRange).Start.Ptr = pcVar3;
        (pNVar5->SourceRange).End.Ptr = pcVar3;
        pNVar5->_vptr_Node = (_func_int **)&PTR_anchor_00213ea0;
        goto LAB_0018df68;
      }
      if (TVar1 != TK_Value) goto LAB_0018e073;
      pNVar5 = (Node *)local_70;
      Scanner::getNext((Token *)pNVar5,
                       *(Scanner **)
                        &((((this->super_Node).Doc)->_M_t).
                          super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                          .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                         stream->scanner);
      bVar4 = true;
      if ((undefined1 *)local_70._24_8_ != local_70 + 0x28) {
        operator_delete((void *)local_70._24_8_,(ulong)(local_70._40_8_ + 1));
      }
    }
    else {
LAB_0018e073:
      Twine::Twine((Twine *)(local_70 + 0x38),"Unexpected token in Key Value.");
      Scanner::setError(*(Scanner **)
                         &((((this->super_Node).Doc)->_M_t).
                           super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                           .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                          stream->scanner,(Twine *)(local_70 + 0x38),(pTVar6->Range).Data);
      pNVar5 = (Node *)BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                                 (&((((this->super_Node).Doc)->_M_t).
                                    super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                    .super__Head_base<0UL,_llvm::yaml::Document_*,_false>.
                                   _M_head_impl)->NodeAllocator,0x48,0x10);
      NullNode::NullNode((NullNode *)pNVar5,(this->super_Node).Doc);
LAB_0018df68:
      this->Value = pNVar5;
      bVar4 = false;
    }
    if (!bVar4) {
      return pNVar5;
    }
    pTVar6 = Scanner::peekNext(*(Scanner **)
                                &((((this->super_Node).Doc)->_M_t).
                                  super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                  .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl
                                 )->stream->scanner);
    if ((pTVar6->Kind != TK_Key) && (pTVar6->Kind != TK_BlockEnd)) {
      pNVar5 = Document::parseBlockNode
                         ((((this->super_Node).Doc)->_M_t).
                          super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                          .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl);
      goto LAB_0018e00e;
    }
    pDVar7 = (((this->super_Node).Doc)->_M_t).
             super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
             ._M_t.
             super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
             .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl;
  }
  pNVar5 = (Node *)BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                             (&pDVar7->NodeAllocator,0x48,0x10);
  puVar2 = (this->super_Node).Doc;
  pNVar5->_vptr_Node = (_func_int **)&PTR_anchor_00213e80;
  ((StringRef *)&pNVar5->Doc)->Data = (char *)puVar2;
  (pNVar5->SourceRange).Start.Ptr = (char *)0x0;
  (pNVar5->SourceRange).End.Ptr = (char *)0x0;
  pNVar5->TypeID = 0;
  (pNVar5->Tag).Data = (char *)0x0;
  (pNVar5->Tag).Length = 0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)&pNVar5->Anchor)->_M_allocated_capacity = 0;
  *(undefined8 *)((long)&pNVar5->Anchor + 8) = 0;
  pTVar6 = Scanner::peekNext(*(Scanner **)
                              &((puVar2->_M_t).
                                super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)
                               ->stream->scanner);
  pcVar3 = (pTVar6->Range).Data;
  (pNVar5->SourceRange).Start.Ptr = pcVar3;
  (pNVar5->SourceRange).End.Ptr = pcVar3;
  pNVar5->_vptr_Node = (_func_int **)&PTR_anchor_00213ea0;
LAB_0018e00e:
  this->Value = pNVar5;
  return pNVar5;
}

Assistant:

Node *KeyValueNode::getValue() {
  if (Value)
    return Value;
  getKey()->skip();
  if (failed())
    return Value = new (getAllocator()) NullNode(Doc);

  // Handle implicit null values.
  {
    Token &t = peekNext();
    if (   t.Kind == Token::TK_BlockEnd
        || t.Kind == Token::TK_FlowMappingEnd
        || t.Kind == Token::TK_Key
        || t.Kind == Token::TK_FlowEntry
        || t.Kind == Token::TK_Error) {
      return Value = new (getAllocator()) NullNode(Doc);
    }

    if (t.Kind != Token::TK_Value) {
      setError("Unexpected token in Key Value.", t);
      return Value = new (getAllocator()) NullNode(Doc);
    }
    getNext(); // skip TK_Value.
  }

  // Handle explicit null values.
  Token &t = peekNext();
  if (t.Kind == Token::TK_BlockEnd || t.Kind == Token::TK_Key) {
    return Value = new (getAllocator()) NullNode(Doc);
  }

  // We got a normal value.
  return Value = parseBlockNode();
}